

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O3

json_t * json_vpack_ex(json_error_t *error,size_t flags,char *fmt,__va_list_tag *ap)

{
  undefined8 uVar1;
  json_t *json;
  byte *pbVar2;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  va_list ap_copy;
  scanner_t local_c0;
  __va_list_tag local_48;
  
  if ((fmt == (char *)0x0) || (*fmt == '\0')) {
    jsonp_error_init(error,"<format>");
    json = (json_t *)0x0;
    jsonp_error_set(error,-1,-1,0,"NULL or empty format string");
  }
  else {
    jsonp_error_init(error,(char *)0x0);
    local_c0.prev_token.line = 0;
    local_c0.prev_token.column = 0;
    local_c0.prev_token.pos = 0;
    local_c0.prev_token.token = '\0';
    local_c0.prev_token._17_7_ = 0;
    local_c0.next_token.line = 0;
    local_c0.next_token.column = 0;
    local_c0.next_token.pos = 0;
    local_c0.next_token.token = '\0';
    local_c0.next_token._17_7_ = 0;
    local_c0.token.pos = 1;
    local_c0.line = 1;
    local_c0.column = 1;
    while( true ) {
      local_c0.token.token = fmt[local_c0.token.pos - 1];
      uVar4 = (ulong)(byte)local_c0.token.token;
      if (0x3a < uVar4) break;
      if ((0x400100100000200U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 10) break;
        local_c0.line = local_c0.line + 1;
        local_c0.column = 1;
      }
      else {
        local_c0.column = local_c0.column + 1;
      }
      local_c0.token.pos = local_c0.token.pos + 1;
    }
    local_c0.token._17_7_ = 0;
    local_c0.token.column = local_c0.column;
    local_c0.token.line = local_c0.line;
    local_c0.fmt = fmt + local_c0.token.pos;
    local_48.gp_offset = ap->gp_offset;
    local_48.fp_offset = ap->fp_offset;
    local_48.overflow_arg_area = ap->overflow_arg_area;
    local_48.reg_save_area = ap->reg_save_area;
    local_c0.start = fmt;
    local_c0.error = error;
    local_c0.flags = flags;
    local_c0.pos = local_c0.token.pos;
    json = pack(&local_c0,(va_list *)&local_48);
    if (json == (json_t *)0x0) {
      json = (json_t *)0x0;
    }
    else {
      local_c0.prev_token.token = local_c0.token.token;
      local_c0.prev_token._17_7_ = local_c0.token._17_7_;
      local_c0.prev_token.line = local_c0.token.line;
      local_c0.prev_token.column = local_c0.token.column;
      local_c0.prev_token.pos = local_c0.token.pos;
      if (local_c0.next_token.line == 0) {
        local_c0.column = local_c0.column + 1;
        pbVar2 = (byte *)local_c0.fmt;
        local_c0.token.line = local_c0.line;
        while( true ) {
          local_c0.token.pos = local_c0.pos + 1;
          local_c0.fmt = (char *)(pbVar2 + 1);
          bVar5 = *pbVar2;
          uVar4 = (ulong)bVar5;
          local_c0.pos = local_c0.token.pos;
          if (0x3a < uVar4) break;
          pbVar2 = (byte *)local_c0.fmt;
          if ((0x400100100000200U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 != 10) break;
            local_c0.token.line = local_c0.token.line + 1;
            local_c0.column = 1;
            local_c0.line = local_c0.token.line;
          }
          else {
            local_c0.column = local_c0.column + 1;
          }
        }
        local_c0.token.token = bVar5;
        local_c0.token.column = local_c0.column;
      }
      else {
        local_c0.token.token = local_c0.next_token.token;
        local_c0.token._17_7_ = local_c0.next_token._17_7_;
        uVar1 = local_c0.token._16_8_;
        local_c0.token.line = local_c0.next_token.line;
        local_c0.token.column = local_c0.next_token.column;
        local_c0.token.pos = local_c0.next_token.pos;
        local_c0.next_token._0_8_ = local_c0.next_token._0_8_ & 0xffffffff00000000;
        local_c0.token.token = local_c0.next_token.token;
        bVar5 = local_c0.token.token;
        local_c0.token._16_8_ = uVar1;
      }
      if (bVar5 != 0) {
        if ((json->refcount != 0xffffffffffffffff) &&
           (sVar3 = json->refcount - 1, json->refcount = sVar3, sVar3 == 0)) {
          json_delete(json);
        }
        json = (json_t *)0x0;
        set_error(&local_c0,"<format>","Garbage after format string");
      }
    }
  }
  return json;
}

Assistant:

json_t *json_vpack_ex(json_error_t *error, size_t flags,
                      const char *fmt, va_list ap)
{
    scanner_t s;
    va_list ap_copy;
    json_t *value;

    if(!fmt || !*fmt) {
        jsonp_error_init(error, "<format>");
        jsonp_error_set(error, -1, -1, 0, "NULL or empty format string");
        return NULL;
    }
    jsonp_error_init(error, NULL);

    scanner_init(&s, error, flags, fmt);
    next_token(&s);

    va_copy(ap_copy, ap);
    value = pack(&s, &ap_copy);
    va_end(ap_copy);

    if(!value)
        return NULL;

    next_token(&s);
    if(token(&s)) {
        json_decref(value);
        set_error(&s, "<format>", "Garbage after format string");
        return NULL;
    }

    return value;
}